

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

wchar_t find_inven(object *obj)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj_00;
  
  obj_00 = player->gear;
  if (obj_00 == (object *)0x0) {
LAB_001b2a9d:
    wVar2 = L'\0';
  }
  else {
    wVar2 = L'\0';
    do {
      _Var1 = object_is_equipped(player->body,obj_00);
      if ((!_Var1) && (obj->kind == obj_00->kind)) {
        if (obj->tval - 2 < 0x14) {
          if ((((((obj->to_h != obj_00->to_h) || (obj->to_d != obj_00->to_d)) ||
                (obj->to_a != obj_00->to_a)) ||
               ((obj->artifact != obj_00->artifact || (obj->ego != obj_00->ego)))) ||
              ((obj->timeout != obj_00->timeout && (_Var1 = tval_is_light(obj), _Var1)))) ||
             (((obj->ac != obj_00->ac || (obj->dd != obj_00->dd)) || (obj->ds != obj_00->ds))))
          goto LAB_001b2a8e;
        }
        else if (obj->tval == 1) goto LAB_001b2a9d;
        _Var1 = flag_is_equal(obj->flags,obj_00->flags,5);
        if (_Var1) {
          wVar2 = wVar2 + (uint)obj_00->number;
        }
      }
LAB_001b2a8e:
      obj_00 = obj_00->next;
    } while (obj_00 != (object *)0x0);
  }
  return wVar2;
}

Assistant:

int find_inven(const struct object *obj)
{
	int i;
	struct object *gear_obj;
	int num = 0;

	/* Similar slot? */
	for (gear_obj = player->gear; gear_obj; gear_obj = gear_obj->next) {
		/* Check only the inventory and the quiver */
		if (object_is_equipped(player->body, gear_obj))
			continue;

		/* Require identical object types */
		if (obj->kind != gear_obj->kind)
			continue;

		/* Analyze the items */
		switch (obj->tval)
		{
			/* Chests */
			case TV_CHEST:
			{
				/* Never okay */
				return 0;
			}

			/* Food and Potions and Scrolls */
			case TV_FOOD:
			case TV_MUSHROOM:
			case TV_POTION:
			case TV_SCROLL:
			{
				/* Assume okay */
				break;
			}

			/* Staves and Wands */
			case TV_STAFF:
			case TV_WAND:
			{
				/* Assume okay */
				break;
			}

			/* Rods */
			case TV_ROD:
			{
				/* Assume okay */
				break;
			}

			/* Wearables */
			case TV_BOW:
			case TV_DIGGING:
			case TV_HAFTED:
			case TV_POLEARM:
			case TV_SWORD:
			case TV_BOOTS:
			case TV_GLOVES:
			case TV_HELM:
			case TV_CROWN:
			case TV_SHIELD:
			case TV_CLOAK:
			case TV_SOFT_ARMOR:
			case TV_HARD_ARMOR:
			case TV_DRAG_ARMOR:
			case TV_RING:
			case TV_AMULET:
			case TV_LIGHT:
			case TV_BOLT:
			case TV_ARROW:
			case TV_SHOT:
			{
				/* Require identical "bonuses" */
				if (obj->to_h != gear_obj->to_h)
					continue;
				if (obj->to_d != gear_obj->to_d)
					continue;
				if (obj->to_a != gear_obj->to_a)
					continue;

				/* Require identical modifiers */
				for (i = 0; i < OBJ_MOD_MAX; i++)
					if (obj->modifiers[i] != gear_obj->modifiers[i])
						continue;

				/* Require identical "artifact" names */
				if (obj->artifact != gear_obj->artifact)
					continue;

				/* Require identical "ego-item" names */
				if (obj->ego != gear_obj->ego)
					continue;

				/* Lights must have same amount of fuel */
				else if (obj->timeout != gear_obj->timeout &&
						 tval_is_light(obj))
					continue;

				/* Require identical "values" */
				if (obj->ac != gear_obj->ac)
					continue;
				if (obj->dd != gear_obj->dd)
					continue;
				if (obj->ds != gear_obj->ds)
					continue;

				/* Probably okay */
				break;
			}

			/* Various */
			default:
			{
				/* Probably okay */
				break;
			}
		}


		/* Different flags */
		if (!of_is_equal(obj->flags, gear_obj->flags))
			continue;

		/* They match, so add up */
		num += gear_obj->number;
	}

	return num;
}